

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O3

int __thiscall CS248::Viewer::init(Viewer *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  GLenum GVar2;
  long *plVar3;
  OSDText *pOVar4;
  long *extraout_RAX;
  ostream *poVar5;
  long *plVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  int width;
  Color color;
  Color color_00;
  string title;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  string *text;
  
  glfwSetErrorCallback(err_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
    poVar5 = std::operator<<(poVar5,"[CS248] ");
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"Error: could not initialize GLFW!");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    std::flush<char,std::char_traits<char>>(poVar5);
  }
  else {
    if (renderer == (long *)0x0) {
      local_90 = &local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CS248","");
    }
    else {
      (**(code **)(*renderer + 0x28))(local_30);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_30,0,(char *)0x0,0x23e95e);
      local_90 = &local_80;
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_80 = *plVar6;
        lStack_78 = plVar3[3];
      }
      else {
        local_80 = *plVar6;
        local_90 = (long *)*plVar3;
      }
      local_88 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_30[0] != local_20) {
        operator_delete(local_30[0]);
      }
    }
    window = glfwCreateWindow(0x3c0,0x280,(char *)local_90,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (window == (GLFWwindow *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[31m",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[CS248] ",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error: could not create window!",0x1f);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::ostream::flush();
      glfwTerminate();
    }
    else {
      glfwMakeContextCurrent(window);
      glfwSwapInterval(1);
      glfwSetFramebufferSizeCallback(window,resize_callback);
      glfwSetKeyCallback(window,key_callback);
      glfwSetCharCallback(window,char_callback);
      glfwSetCursorPosCallback(window,cursor_callback);
      glfwSetScrollCallback(window,scroll_callback);
      glfwSetInputMode(window,0x33003,1);
      glfwSetMouseButtonCallback(window,mouse_button_callback);
      GVar2 = glewInit();
      if (GVar2 == 0) {
        glEnable(0xbe2);
        glBlendFunc(0x302,0x303);
        glfwGetFramebufferSize(window,(int *)&buffer_w,(int *)&buffer_h);
        plVar3 = renderer;
        if (0x3c0 < buffer_w) {
          HDPI = 1;
        }
        if (renderer != (long *)0x0) {
          if (HDPI == 1) {
            *(undefined1 *)(renderer + 1) = 1;
          }
          (**(code **)(*plVar3 + 0x10))();
        }
        pOVar4 = (OSDText *)operator_new(0x60);
        OSDText::OSDText(pOVar4);
        osd_text = pOVar4;
        iVar1 = OSDText::init(pOVar4,(EVP_PKEY_CTX *)(ulong)HDPI);
        pOVar4 = osd_text;
        if (-1 < iVar1) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Renderer","");
          color.b = 0.15;
          color.a = 1.0;
          color.r = 0.15;
          color.g = 0.5;
          line_id_renderer = OSDText::add_line(pOVar4,-0.95,0.9,&local_50,0x12,color);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          pOVar4 = osd_text;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Framerate","");
          text = &local_70;
          color_00.b = 0.15;
          color_00.a = 1.0;
          color_00.r = 0.15;
          color_00.g = 0.5;
          line_id_framerate = OSDText::add_line(pOVar4,-0.98,-0.96,text,0xe,color_00);
          width = (int)text;
          iVar1 = extraout_EDX;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
            iVar1 = extraout_EDX_00;
          }
          resize_callback(window,width,iVar1);
          plVar3 = &local_80;
          if (local_90 != plVar3) {
            operator_delete(local_90);
            plVar3 = extraout_RAX;
          }
          return (int)plVar3;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[31m",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[CS248] ",8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error: could not initialize on-screen display!",0x2e);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[31m",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[CS248] ",8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error: could not initialize GLEW!",0x21);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::ostream::flush();
        glfwTerminate();
      }
    }
  }
  exit(1);
}

Assistant:

void Viewer::init() {

  // initialize glfw
  glfwSetErrorCallback( err_callback );
  if( !glfwInit() ) {
    out_err("Error: could not initialize GLFW!");
    exit( 1 );
  }

  // create window
  string title = renderer ? "CS248: " + renderer->name() : "CS248";
  window = glfwCreateWindow( DEFAULT_W, DEFAULT_H, title.c_str(), NULL, NULL );
  if (!window) {
    out_err("Error: could not create window!");
    glfwTerminate();
    exit( 1 );
  }

  // set context
  glfwMakeContextCurrent( window );
  glfwSwapInterval(1);

  // framebuffer event callbacks
  glfwSetFramebufferSizeCallback( window, resize_callback );
  
  // key event callbacks
  glfwSetKeyCallback( window, key_callback );

  // character event callbacks
  glfwSetCharCallback( window, char_callback );
  
  // cursor event callbacks
  glfwSetCursorPosCallback( window, cursor_callback );

  // wheel event callbacks
  glfwSetScrollCallback(window, scroll_callback);  
  
  // mouse button callbacks
  glfwSetInputMode(window, GLFW_STICKY_MOUSE_BUTTONS, 1);
  glfwSetMouseButtonCallback(window, mouse_button_callback);

  // initialize glew
  if (glewInit() != GLEW_OK) {
    out_err("Error: could not initialize GLEW!");
    glfwTerminate();
    exit( 1 );
  }

  // enable alpha blending
  glEnable(GL_BLEND);
  glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);

  // resize components to current window size, get DPI
  glfwGetFramebufferSize(window, (int*) &buffer_w, (int*) &buffer_h );
  if( buffer_w > DEFAULT_W ) HDPI = true;

  // initialize renderer if already set
  if (renderer){
    if (HDPI) renderer->use_hdpi_reneder_target();
    renderer->init();
  } 

  // initialize status OSD
  osd_text = new OSDText();
  if (osd_text->init(HDPI) < 0) {
    out_err("Error: could not initialize on-screen display!");
    exit( 1 );
  }
  
  // add lines for renderer and fps
  line_id_renderer  = osd_text->add_line(-0.95,  0.90, "Renderer", 
                                          18, Color(0.15, 0.5, 0.15));
  line_id_framerate = osd_text->add_line(-0.98, -0.96, "Framerate", 
                                          14, Color(0.15, 0.5, 0.15));

  // resize elements to current size
  resize_callback(window, buffer_w, buffer_h);

}